

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void substSelect(SubstContext *pSubst,Select *p,int doPrior)

{
  Parse *pPVar1;
  Expr *pEVar2;
  int in_EDX;
  SubstContext *in_RSI;
  int i;
  SrcList_item *pItem;
  SrcList *pSrc;
  undefined4 in_stack_00000020;
  ExprList *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  uint uVar3;
  int in_stack_ffffffffffffffd4;
  int *local_28;
  int *piVar4;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_RSI != (SubstContext *)0x0) {
    do {
      substExprList((SubstContext *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8);
      substExprList((SubstContext *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8);
      substExprList((SubstContext *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8);
      pPVar1 = (Parse *)substExpr((SubstContext *)p,(Expr *)CONCAT44(doPrior,in_stack_00000020));
      in_RSI[2].pParse = pPVar1;
      pEVar2 = substExpr((SubstContext *)p,(Expr *)CONCAT44(doPrior,in_stack_00000020));
      *(Expr **)&in_RSI[1].isLeftJoin = pEVar2;
      piVar4 = *(int **)&in_RSI[1].iTable;
      local_28 = piVar4 + 2;
      for (in_stack_ffffffffffffffd4 = *piVar4; 0 < in_stack_ffffffffffffffd4;
          in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + -1) {
        substSelect(in_RSI,(Select *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                    (int)((ulong)piVar4 >> 0x20));
        if ((*(byte *)((long)local_28 + 0x3d) >> 2 & 1) != 0) {
          substExprList((SubstContext *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
        }
        local_28 = local_28 + 0x1c;
      }
      uVar3 = in_stack_ffffffffffffffd0 & 0xffffff;
      if (in_EDX != 0) {
        in_RSI = *(SubstContext **)&in_RSI[2].isLeftJoin;
        uVar3 = CONCAT13(in_RSI != (SubstContext *)0x0,(int3)in_stack_ffffffffffffffd0);
      }
      in_stack_ffffffffffffffd0 = uVar3;
    } while ((char)(uVar3 >> 0x18) != '\0');
  }
  return;
}

Assistant:

static void substSelect(
  SubstContext *pSubst, /* Description of the substitution */
  Select *p,            /* SELECT statement in which to make substitutions */
  int doPrior           /* Do substitutes on p->pPrior too */
){
  SrcList *pSrc;
  struct SrcList_item *pItem;
  int i;
  if( !p ) return;
  do{
    substExprList(pSubst, p->pEList);
    substExprList(pSubst, p->pGroupBy);
    substExprList(pSubst, p->pOrderBy);
    p->pHaving = substExpr(pSubst, p->pHaving);
    p->pWhere = substExpr(pSubst, p->pWhere);
    pSrc = p->pSrc;
    assert( pSrc!=0 );
    for(i=pSrc->nSrc, pItem=pSrc->a; i>0; i--, pItem++){
      substSelect(pSubst, pItem->pSelect, 1);
      if( pItem->fg.isTabFunc ){
        substExprList(pSubst, pItem->u1.pFuncArg);
      }
    }
  }while( doPrior && (p = p->pPrior)!=0 );
}